

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

double __thiscall icu_63::CalendarAstronomer::getGreenwichSidereal(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  double dVar3;
  
  UVar1 = uprv_isNaN_63(this->siderealTime);
  if (UVar1 == '\0') {
    dVar2 = this->siderealTime;
  }
  else {
    dVar2 = normalize(this->fTime / 3600000.0,24.0);
    dVar3 = getSiderealOffset(this);
    dVar2 = normalize(dVar3 + dVar2 * 1.002737909,24.0);
    this->siderealTime = dVar2;
  }
  return dVar2;
}

Assistant:

double CalendarAstronomer::getGreenwichSidereal() {
    if (isINVALID(siderealTime)) {
        // See page 86 of "Practial Astronomy with your Calculator",
        // by Peter Duffet-Smith, for details on the algorithm.

        double UT = normalize(fTime/(double)HOUR_MS, 24.);

        siderealTime = normalize(getSiderealOffset() + UT*1.002737909, 24.);
    }
    return siderealTime;
}